

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonelist.h
# Opt level: O0

int __thiscall
asmjit::v1_14::ZoneList<asmjit::v1_14::JitAllocatorBlock>::unlink
          (ZoneList<asmjit::v1_14::JitAllocatorBlock> *this,char *__name)

{
  long lVar1;
  long lVar2;
  JitAllocatorBlock *next;
  JitAllocatorBlock *prev;
  JitAllocatorBlock *node_local;
  ZoneList<asmjit::v1_14::JitAllocatorBlock> *this_local;
  
  lVar1 = *(long *)(__name + 0x10);
  lVar2 = *(long *)(__name + 0x18);
  if (lVar1 == 0) {
    *(long *)this = lVar2;
  }
  else {
    *(long *)(lVar1 + 0x18) = lVar2;
    __name[0x10] = '\0';
    __name[0x11] = '\0';
    __name[0x12] = '\0';
    __name[0x13] = '\0';
    __name[0x14] = '\0';
    __name[0x15] = '\0';
    __name[0x16] = '\0';
    __name[0x17] = '\0';
  }
  if (lVar2 == 0) {
    *(long *)(this + 8) = lVar1;
  }
  else {
    *(long *)(lVar2 + 0x10) = lVar1;
    __name[0x18] = '\0';
    __name[0x19] = '\0';
    __name[0x1a] = '\0';
    __name[0x1b] = '\0';
    __name[0x1c] = '\0';
    __name[0x1d] = '\0';
    __name[0x1e] = '\0';
    __name[0x1f] = '\0';
  }
  __name[0x10] = '\0';
  __name[0x11] = '\0';
  __name[0x12] = '\0';
  __name[0x13] = '\0';
  __name[0x14] = '\0';
  __name[0x15] = '\0';
  __name[0x16] = '\0';
  __name[0x17] = '\0';
  __name[0x18] = '\0';
  __name[0x19] = '\0';
  __name[0x1a] = '\0';
  __name[0x1b] = '\0';
  __name[0x1c] = '\0';
  __name[0x1d] = '\0';
  __name[0x1e] = '\0';
  __name[0x1f] = '\0';
  return (int)__name;
}

Assistant:

inline NodeT* unlink(NodeT* node) noexcept {
    NodeT* prev = node->prev();
    NodeT* next = node->next();

    if (prev) { prev->_listNodes[1] = next; node->_listNodes[0] = nullptr; } else { _nodes[0] = next; }
    if (next) { next->_listNodes[0] = prev; node->_listNodes[1] = nullptr; } else { _nodes[1] = prev; }

    node->_listNodes[0] = nullptr;
    node->_listNodes[1] = nullptr;

    return node;
  }